

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codebook.c
# Opt level: O0

int vorbis_staticbook_pack(static_codebook *c,oggpack_buffer *opb)

{
  char cVar1;
  int iVar2;
  long lVar3;
  unsigned_long value;
  int local_48;
  int quantvals;
  char last;
  char this;
  long count;
  long lStack_30;
  int ordered;
  long j;
  long i;
  oggpack_buffer *opb_local;
  static_codebook *c_local;
  
  oggpack_write(opb,0x564342,0x18);
  oggpack_write(opb,c->dim,0x10);
  oggpack_write(opb,c->entries,0x18);
  for (j = 1; ((j < c->entries && (c->lengthlist[j + -1] != '\0')) &&
              (c->lengthlist[j + -1] <= c->lengthlist[j])); j = j + 1) {
  }
  if (j == c->entries) {
    _quantvals = 0;
    oggpack_write(opb,1,1);
    oggpack_write(opb,(long)(*c->lengthlist + -1),5);
    for (j = 1; j < c->entries; j = j + 1) {
      cVar1 = c->lengthlist[j];
      if (c->lengthlist[j + -1] < cVar1) {
        for (lStack_30 = (long)c->lengthlist[j + -1]; lStack_30 < cVar1; lStack_30 = lStack_30 + 1)
        {
          iVar2 = ov_ilog((int)c->entries - (int)_quantvals);
          oggpack_write(opb,j - _quantvals,iVar2);
          _quantvals = j;
        }
      }
    }
    iVar2 = ov_ilog((int)c->entries - (int)_quantvals);
    oggpack_write(opb,j - _quantvals,iVar2);
  }
  else {
    oggpack_write(opb,0,1);
    for (j = 0; (j < c->entries && (c->lengthlist[j] != '\0')); j = j + 1) {
    }
    if (j == c->entries) {
      oggpack_write(opb,0,1);
      for (j = 0; j < c->entries; j = j + 1) {
        oggpack_write(opb,(long)(c->lengthlist[j] + -1),5);
      }
    }
    else {
      oggpack_write(opb,1,1);
      for (j = 0; j < c->entries; j = j + 1) {
        if (c->lengthlist[j] == '\0') {
          oggpack_write(opb,0,1);
        }
        else {
          oggpack_write(opb,1,1);
          oggpack_write(opb,(long)(c->lengthlist[j] + -1),5);
        }
      }
    }
  }
  oggpack_write(opb,(long)c->maptype,4);
  if (c->maptype != 0) {
    if (1 < c->maptype - 1U) {
      return -1;
    }
    if (c->quantlist == (long *)0x0) {
      return -1;
    }
    oggpack_write(opb,c->q_min,0x20);
    oggpack_write(opb,c->q_delta,0x20);
    oggpack_write(opb,(long)(c->q_quant + -1),4);
    oggpack_write(opb,(long)c->q_sequencep,1);
    if (c->maptype == 1) {
      lVar3 = _book_maptype1_quantvals(c);
      local_48 = (int)lVar3;
    }
    else if (c->maptype == 2) {
      local_48 = (int)c->entries * (int)c->dim;
    }
    else {
      local_48 = -1;
    }
    for (j = 0; j < local_48; j = j + 1) {
      value = c->quantlist[j];
      if ((long)value < 1) {
        value = -value;
      }
      oggpack_write(opb,value,c->q_quant);
    }
  }
  return 0;
}

Assistant:

int vorbis_staticbook_pack(const static_codebook *c,oggpack_buffer *opb){
  long i,j;
  int ordered=0;

  /* first the basic parameters */
  oggpack_write(opb,0x564342,24);
  oggpack_write(opb,c->dim,16);
  oggpack_write(opb,c->entries,24);

  /* pack the codewords.  There are two packings; length ordered and
     length random.  Decide between the two now. */

  for(i=1;i<c->entries;i++)
    if(c->lengthlist[i-1]==0 || c->lengthlist[i]<c->lengthlist[i-1])break;
  if(i==c->entries)ordered=1;

  if(ordered){
    /* length ordered.  We only need to say how many codewords of
       each length.  The actual codewords are generated
       deterministically */

    long count=0;
    oggpack_write(opb,1,1);  /* ordered */
    oggpack_write(opb,c->lengthlist[0]-1,5); /* 1 to 32 */

    for(i=1;i<c->entries;i++){
      char this=c->lengthlist[i];
      char last=c->lengthlist[i-1];
      if(this>last){
        for(j=last;j<this;j++){
          oggpack_write(opb,i-count,ov_ilog(c->entries-count));
          count=i;
        }
      }
    }
    oggpack_write(opb,i-count,ov_ilog(c->entries-count));

  }else{
    /* length random.  Again, we don't code the codeword itself, just
       the length.  This time, though, we have to encode each length */
    oggpack_write(opb,0,1);   /* unordered */

    /* algortihmic mapping has use for 'unused entries', which we tag
       here.  The algorithmic mapping happens as usual, but the unused
       entry has no codeword. */
    for(i=0;i<c->entries;i++)
      if(c->lengthlist[i]==0)break;

    if(i==c->entries){
      oggpack_write(opb,0,1); /* no unused entries */
      for(i=0;i<c->entries;i++)
        oggpack_write(opb,c->lengthlist[i]-1,5);
    }else{
      oggpack_write(opb,1,1); /* we have unused entries; thus we tag */
      for(i=0;i<c->entries;i++){
        if(c->lengthlist[i]==0){
          oggpack_write(opb,0,1);
        }else{
          oggpack_write(opb,1,1);
          oggpack_write(opb,c->lengthlist[i]-1,5);
        }
      }
    }
  }

  /* is the entry number the desired return value, or do we have a
     mapping? If we have a mapping, what type? */
  oggpack_write(opb,c->maptype,4);
  switch(c->maptype){
  case 0:
    /* no mapping */
    break;
  case 1:case 2:
    /* implicitly populated value mapping */
    /* explicitly populated value mapping */

    if(!c->quantlist){
      /* no quantlist?  error */
      return(-1);
    }

    /* values that define the dequantization */
    oggpack_write(opb,c->q_min,32);
    oggpack_write(opb,c->q_delta,32);
    oggpack_write(opb,c->q_quant-1,4);
    oggpack_write(opb,c->q_sequencep,1);

    {
      int quantvals;
      switch(c->maptype){
      case 1:
        /* a single column of (c->entries/c->dim) quantized values for
           building a full value list algorithmically (square lattice) */
        quantvals=_book_maptype1_quantvals(c);
        break;
      case 2:
        /* every value (c->entries*c->dim total) specified explicitly */
        quantvals=c->entries*c->dim;
        break;
      default: /* NOT_REACHABLE */
        quantvals=-1;
      }

      /* quantized values */
      for(i=0;i<quantvals;i++)
        oggpack_write(opb,labs(c->quantlist[i]),c->q_quant);

    }
    break;
  default:
    /* error case; we don't have any other map types now */
    return(-1);
  }

  return(0);
}